

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int sunLoggerIsOutputRank(SUNLogger logger,int *rank_ref)

{
  int retval;
  int *rank_ref_local;
  SUNLogger logger_local;
  
  if (rank_ref != (int *)0x0) {
    *rank_ref = -1;
  }
  return 1;
}

Assistant:

static sunbooleantype sunLoggerIsOutputRank(SUNLogger logger, int* rank_ref)
{
  sunbooleantype retval;

#ifdef SUNDIALS_LOGGING_ENABLE_MPI
  int rank = 0;

  if (logger->commptr)
  {
    MPI_Comm_rank(SUNLOGGER_MPICOMM(logger), &rank);

    if (logger->output_rank < 0)
    {
      if (rank_ref)
      {
        *rank_ref = rank;
      }
      retval = SUNTRUE; /* output all ranks */
    }
    else
    {
      if (rank_ref)
      {
        *rank_ref = rank;
      }
      retval = logger->output_rank == rank;
    }
  }
  else
  {
    retval = SUNTRUE; /* output all ranks */
  }
#else
  if (rank_ref)
  {
    *rank_ref = -1;
  }
  retval = SUNTRUE;
#endif

  return retval;
}